

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O2

void nh_ws_emit(ws_session_t *session,uint32_t payload_len,char *payload,uchar op)

{
  nh_ws_out_context_t *ctx;
  char *__dest;
  ulong __size;
  
  if ((session->flags & 2) == 0) {
    ctx = (nh_ws_out_context_t *)malloc(0x48);
    __size = (ulong)payload_len;
    __dest = (char *)malloc(__size);
    memcpy(__dest,payload,__size);
    (ctx->stream).buf = (char *)0x0;
    (ctx->stream).capacity = 0;
    (ctx->stream).length = 0;
    *(undefined8 *)((long)&(ctx->stream).capacity + 1) = 0;
    *(undefined8 *)((long)&(ctx->stream).index + 1) = 0;
    (ctx->frame).opcode = op;
    (ctx->frame).mask = '\0';
    (ctx->frame).payload_length = __size;
    (ctx->frame).masking_key[0] = '\0';
    (ctx->frame).masking_key[1] = '\0';
    (ctx->frame).masking_key[2] = '\0';
    (ctx->frame).masking_key[3] = '\0';
    (ctx->frame).payload = __dest;
    (ctx->frame).payload_consumed_length = 0;
    ctx->next = (nh_ws_out_context_t *)0x0;
    nh_stream_init((nh_stream_t *)ctx);
    nh_ws_generate_emit_stream(ctx);
    if (session->incomplete_emit == (nh_ws_out_context_t *)0x0) {
      session->incomplete_emit_tail = ctx;
      session->incomplete_emit = ctx;
      nh_ws_emit_handler(session);
      return;
    }
    session->incomplete_emit_tail->next = ctx;
    session->incomplete_emit_tail = ctx;
  }
  return;
}

Assistant:

void nh_ws_emit(ws_session_t *session, uint32_t payload_len, char const payload[payload_len], unsigned char op) {
    if (FLAG_CHECK(session->flags, WEBSOCKET_SESSION_CLOSE)) return;
    nh_ws_out_context_t *ctx = malloc(sizeof(nh_ws_out_context_t));
    // copy payload
    char *payload_copy = malloc(sizeof(char) * payload_len);
    memcpy(payload_copy, payload, payload_len);
    *ctx = (nh_ws_out_context_t) {
        .frame = (nh_ws_frame) {
            .payload_length = payload_len,
            .payload = payload_copy,
            .opcode = op,
        },
        .stream = {0},
        .next = NULL,
    };
    nh_stream_init(&ctx->stream);
    nh_ws_generate_emit_stream(ctx);
    if (session->incomplete_emit != NULL) {
        // append to emit queue
        session->incomplete_emit_tail->next = ctx;
        session->incomplete_emit_tail = ctx;
        return;
    } else {
        session->incomplete_emit = session->incomplete_emit_tail = ctx;
    }
    nh_ws_emit_handler(session);
}